

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

_Bool sysbvm_identitySet_findWithExplicitHash
                (sysbvm_context_t *context,sysbvm_tuple_t set,void *element,
                sysbvm_identitySet_explicitHashFunction_t hashFunction,
                sysbvm_identitySet_explicitEqualsFunction_t equalsFunction,
                sysbvm_tuple_t *outFoundElement)

{
  long lVar1;
  sysbvm_tuple_t sVar2;
  _Bool _Var3;
  size_t sVar4;
  size_t sVar5;
  sysbvm_tuple_t setElement_1;
  size_t i_1;
  sysbvm_tuple_t setElement;
  size_t i;
  size_t hashIndex;
  sysbvm_array_t *storage;
  size_t capacity;
  sysbvm_identitySet_t *setObject;
  sysbvm_tuple_t *outFoundElement_local;
  sysbvm_identitySet_explicitEqualsFunction_t equalsFunction_local;
  sysbvm_identitySet_explicitHashFunction_t hashFunction_local;
  void *element_local;
  sysbvm_tuple_t set_local;
  sysbvm_context_t *context_local;
  
  *outFoundElement = 0;
  _Var3 = sysbvm_tuple_isNonNullPointer(set);
  if ((_Var3) && (sVar4 = sysbvm_tuple_getSizeInSlots(*(sysbvm_tuple_t *)(set + 0x18)), sVar4 != 0))
  {
    lVar1 = *(long *)(set + 0x18);
    sVar5 = (*hashFunction)(context,element);
    for (setElement = sVar5 % sVar4; setElement < sVar4; setElement = setElement + 1) {
      sVar2 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + setElement * 8);
      if (sVar2 == 0x3f) {
        return false;
      }
      _Var3 = (*equalsFunction)(element,sVar2);
      if (_Var3) {
        *outFoundElement = sVar2;
        return true;
      }
    }
    for (setElement_1 = 0; setElement_1 < sVar5 % sVar4; setElement_1 = setElement_1 + 1) {
      sVar2 = *(sysbvm_tuple_t *)(lVar1 + 0x10 + setElement_1 * 8);
      if (sVar2 == 0x3f) {
        return false;
      }
      _Var3 = (*equalsFunction)(element,sVar2);
      if (_Var3) {
        *outFoundElement = sVar2;
        return true;
      }
    }
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_identitySet_findWithExplicitHash(sysbvm_context_t *context, sysbvm_tuple_t set, void *element, sysbvm_identitySet_explicitHashFunction_t hashFunction, sysbvm_identitySet_explicitEqualsFunction_t equalsFunction, sysbvm_tuple_t *outFoundElement)
{
    *outFoundElement = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(set))
        return false;

    sysbvm_identitySet_t *setObject = (sysbvm_identitySet_t*)set;
    size_t capacity = sysbvm_tuple_getSizeInSlots(setObject->storage);
    if(capacity == 0)
        return false;

    sysbvm_array_t *storage = (sysbvm_array_t*)setObject->storage;
    size_t hashIndex = hashFunction(context, element) % capacity;
    for(size_t i = hashIndex; i < capacity; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    for(size_t i = 0; i < hashIndex; ++i)
    {
        sysbvm_tuple_t setElement = storage->elements[i];
        if(setElement == SYSBVM_HASHTABLE_EMPTY_ELEMENT_TUPLE)
            return false;
        
        if(equalsFunction(element, setElement))
        {
            *outFoundElement = setElement;
            return true;
        }
    }

    return false;
}